

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPU4StateImpl.hpp
# Opt level: O0

void __thiscall
beagle::cpu::BeagleCPU4StateImpl<double,_1,_0>::calcPartialsPartialsFixedScaling
          (BeagleCPU4StateImpl<double,_1,_0> *this,double *destP,double *partials1,double *matrices1
          ,double *partials2,double *matrices2,double *scaleFactors,int startPattern,int endPattern)

{
  ulong uVar1;
  double dVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  double dVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  double dVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  double dVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  double dVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  double dVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  double dVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  double dVar30;
  ulong uVar31;
  ulong uVar32;
  double dVar33;
  ulong uVar34;
  double dVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  double dVar39;
  ulong uVar40;
  ulong uVar41;
  int iVar42;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  long in_R8;
  long in_R9;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  double p10;
  double scaleFactor;
  int in_stack_00000010;
  int k;
  double m233;
  double m232;
  double m231;
  double m230;
  double m223;
  double m222;
  double m221;
  double m220;
  double m213;
  double m212;
  double m211;
  double m210;
  double m203;
  double m202;
  double m201;
  double m200;
  double m133;
  double m132;
  double m131;
  double m130;
  double m123;
  double m122;
  double m121;
  double m120;
  double m113;
  double m112;
  double m111;
  double m110;
  double m103;
  double m102;
  double m101;
  double m100;
  int w;
  int u;
  int l;
  undefined4 local_144;
  double sum23;
  double sum22;
  double sum21;
  double sum20;
  double sum13;
  double sum12;
  double sum11;
  double sum10;
  double p23;
  double p22;
  double p21;
  double p20;
  double p13;
  double p12;
  double p11;
  
  for (p23._4_4_ = 0; p23._4_4_ < *(int *)(in_RDI + 0x34); p23._4_4_ = p23._4_4_ + 1) {
    p23._0_4_ = p23._4_4_ * 4 * *(int *)(in_RDI + 0x18);
    if (in_stack_00000010 != 0) {
      p23._0_4_ = in_stack_00000010 * 4 + p23._0_4_;
    }
    iVar42 = p23._4_4_ * 0x14;
    uVar1 = *(ulong *)(in_RCX + (long)iVar42 * 8);
    dVar2 = *(double *)(in_RCX + (long)(iVar42 + 1) * 8);
    uVar3 = *(ulong *)(in_RCX + (long)(iVar42 + 2) * 8);
    uVar4 = *(ulong *)(in_RCX + (long)(iVar42 + 3) * 8);
    uVar5 = *(ulong *)(in_RCX + (long)(iVar42 + 5) * 8);
    dVar6 = *(double *)(in_RCX + (long)(iVar42 + 6) * 8);
    uVar7 = *(ulong *)(in_RCX + (long)(iVar42 + 7) * 8);
    uVar8 = *(ulong *)(in_RCX + (long)(iVar42 + 8) * 8);
    uVar9 = *(ulong *)(in_RCX + (long)(iVar42 + 10) * 8);
    dVar10 = *(double *)(in_RCX + (long)(iVar42 + 0xb) * 8);
    uVar11 = *(ulong *)(in_RCX + (long)(iVar42 + 0xc) * 8);
    uVar12 = *(ulong *)(in_RCX + (long)(iVar42 + 0xd) * 8);
    uVar13 = *(ulong *)(in_RCX + (long)(iVar42 + 0xf) * 8);
    dVar14 = *(double *)(in_RCX + (long)(iVar42 + 0x10) * 8);
    uVar15 = *(ulong *)(in_RCX + (long)(iVar42 + 0x11) * 8);
    uVar16 = *(ulong *)(in_RCX + (long)(iVar42 + 0x12) * 8);
    uVar17 = *(ulong *)(in_R9 + (long)iVar42 * 8);
    dVar18 = *(double *)(in_R9 + (long)(iVar42 + 1) * 8);
    uVar19 = *(ulong *)(in_R9 + (long)(iVar42 + 2) * 8);
    uVar20 = *(ulong *)(in_R9 + (long)(iVar42 + 3) * 8);
    uVar21 = *(ulong *)(in_R9 + (long)(iVar42 + 5) * 8);
    dVar22 = *(double *)(in_R9 + (long)(iVar42 + 6) * 8);
    uVar23 = *(ulong *)(in_R9 + (long)(iVar42 + 7) * 8);
    uVar24 = *(ulong *)(in_R9 + (long)(iVar42 + 8) * 8);
    uVar25 = *(ulong *)(in_R9 + (long)(iVar42 + 10) * 8);
    dVar26 = *(double *)(in_R9 + (long)(iVar42 + 0xb) * 8);
    uVar27 = *(ulong *)(in_R9 + (long)(iVar42 + 0xc) * 8);
    uVar28 = *(ulong *)(in_R9 + (long)(iVar42 + 0xd) * 8);
    uVar29 = *(ulong *)(in_R9 + (long)(iVar42 + 0xf) * 8);
    dVar30 = *(double *)(in_R9 + (long)(iVar42 + 0x10) * 8);
    uVar31 = *(ulong *)(in_R9 + (long)(iVar42 + 0x11) * 8);
    uVar32 = *(ulong *)(in_R9 + (long)(iVar42 + 0x12) * 8);
    for (local_144 = in_stack_00000010; local_144 < m233._0_4_; local_144 = local_144 + 1) {
      dVar33 = *(double *)((long)scaleFactor + (long)local_144 * 8);
      uVar34 = *(ulong *)(in_RDX + (long)p23._0_4_ * 8);
      dVar35 = *(double *)(in_RDX + (long)(p23._0_4_ + 1) * 8);
      uVar36 = *(ulong *)(in_RDX + (long)(p23._0_4_ + 2) * 8);
      uVar37 = *(ulong *)(in_RDX + (long)(p23._0_4_ + 3) * 8);
      uVar38 = *(ulong *)(in_R8 + (long)p23._0_4_ * 8);
      dVar39 = *(double *)(in_R8 + (long)(p23._0_4_ + 1) * 8);
      uVar40 = *(ulong *)(in_R8 + (long)(p23._0_4_ + 2) * 8);
      uVar41 = *(ulong *)(in_R8 + (long)(p23._0_4_ + 3) * 8);
      auVar43._8_8_ = 0;
      auVar43._0_8_ = uVar1;
      auVar67._8_8_ = 0;
      auVar67._0_8_ = uVar34;
      auVar83._8_8_ = 0;
      auVar83._0_8_ = dVar2 * dVar35;
      auVar43 = vfmadd213sd_fma(auVar67,auVar43,auVar83);
      auVar44._8_8_ = 0;
      auVar44._0_8_ = uVar3;
      auVar84._8_8_ = 0;
      auVar84._0_8_ = uVar36;
      auVar43 = vfmadd213sd_fma(auVar84,auVar44,auVar43);
      auVar68._8_8_ = 0;
      auVar68._0_8_ = uVar4;
      auVar45._8_8_ = 0;
      auVar45._0_8_ = uVar37;
      auVar43 = vfmadd213sd_fma(auVar45,auVar68,auVar43);
      auVar46._8_8_ = 0;
      auVar46._0_8_ = uVar5;
      auVar69._8_8_ = 0;
      auVar69._0_8_ = uVar34;
      auVar85._8_8_ = 0;
      auVar85._0_8_ = dVar6 * dVar35;
      auVar44 = vfmadd213sd_fma(auVar69,auVar46,auVar85);
      auVar47._8_8_ = 0;
      auVar47._0_8_ = uVar7;
      auVar86._8_8_ = 0;
      auVar86._0_8_ = uVar36;
      auVar44 = vfmadd213sd_fma(auVar86,auVar47,auVar44);
      auVar70._8_8_ = 0;
      auVar70._0_8_ = uVar8;
      auVar48._8_8_ = 0;
      auVar48._0_8_ = uVar37;
      auVar44 = vfmadd213sd_fma(auVar48,auVar70,auVar44);
      auVar49._8_8_ = 0;
      auVar49._0_8_ = uVar9;
      auVar71._8_8_ = 0;
      auVar71._0_8_ = uVar34;
      auVar87._8_8_ = 0;
      auVar87._0_8_ = dVar10 * dVar35;
      auVar45 = vfmadd213sd_fma(auVar71,auVar49,auVar87);
      auVar50._8_8_ = 0;
      auVar50._0_8_ = uVar11;
      auVar88._8_8_ = 0;
      auVar88._0_8_ = uVar36;
      auVar45 = vfmadd213sd_fma(auVar88,auVar50,auVar45);
      auVar72._8_8_ = 0;
      auVar72._0_8_ = uVar12;
      auVar51._8_8_ = 0;
      auVar51._0_8_ = uVar37;
      auVar45 = vfmadd213sd_fma(auVar51,auVar72,auVar45);
      auVar52._8_8_ = 0;
      auVar52._0_8_ = uVar13;
      auVar73._8_8_ = 0;
      auVar73._0_8_ = uVar34;
      auVar89._8_8_ = 0;
      auVar89._0_8_ = dVar14 * dVar35;
      auVar46 = vfmadd213sd_fma(auVar73,auVar52,auVar89);
      auVar53._8_8_ = 0;
      auVar53._0_8_ = uVar15;
      auVar90._8_8_ = 0;
      auVar90._0_8_ = uVar36;
      auVar46 = vfmadd213sd_fma(auVar90,auVar53,auVar46);
      auVar74._8_8_ = 0;
      auVar74._0_8_ = uVar16;
      auVar54._8_8_ = 0;
      auVar54._0_8_ = uVar37;
      auVar46 = vfmadd213sd_fma(auVar54,auVar74,auVar46);
      auVar55._8_8_ = 0;
      auVar55._0_8_ = uVar17;
      auVar75._8_8_ = 0;
      auVar75._0_8_ = uVar38;
      auVar91._8_8_ = 0;
      auVar91._0_8_ = dVar18 * dVar39;
      auVar47 = vfmadd213sd_fma(auVar75,auVar55,auVar91);
      auVar56._8_8_ = 0;
      auVar56._0_8_ = uVar19;
      auVar92._8_8_ = 0;
      auVar92._0_8_ = uVar40;
      auVar47 = vfmadd213sd_fma(auVar92,auVar56,auVar47);
      auVar76._8_8_ = 0;
      auVar76._0_8_ = uVar20;
      auVar57._8_8_ = 0;
      auVar57._0_8_ = uVar41;
      auVar47 = vfmadd213sd_fma(auVar57,auVar76,auVar47);
      auVar58._8_8_ = 0;
      auVar58._0_8_ = uVar21;
      auVar77._8_8_ = 0;
      auVar77._0_8_ = uVar38;
      auVar93._8_8_ = 0;
      auVar93._0_8_ = dVar22 * dVar39;
      auVar48 = vfmadd213sd_fma(auVar77,auVar58,auVar93);
      auVar59._8_8_ = 0;
      auVar59._0_8_ = uVar23;
      auVar94._8_8_ = 0;
      auVar94._0_8_ = uVar40;
      auVar48 = vfmadd213sd_fma(auVar94,auVar59,auVar48);
      auVar78._8_8_ = 0;
      auVar78._0_8_ = uVar24;
      auVar60._8_8_ = 0;
      auVar60._0_8_ = uVar41;
      auVar48 = vfmadd213sd_fma(auVar60,auVar78,auVar48);
      auVar61._8_8_ = 0;
      auVar61._0_8_ = uVar25;
      auVar79._8_8_ = 0;
      auVar79._0_8_ = uVar38;
      auVar95._8_8_ = 0;
      auVar95._0_8_ = dVar26 * dVar39;
      auVar49 = vfmadd213sd_fma(auVar79,auVar61,auVar95);
      auVar62._8_8_ = 0;
      auVar62._0_8_ = uVar27;
      auVar96._8_8_ = 0;
      auVar96._0_8_ = uVar40;
      auVar49 = vfmadd213sd_fma(auVar96,auVar62,auVar49);
      auVar80._8_8_ = 0;
      auVar80._0_8_ = uVar28;
      auVar63._8_8_ = 0;
      auVar63._0_8_ = uVar41;
      auVar49 = vfmadd213sd_fma(auVar63,auVar80,auVar49);
      auVar64._8_8_ = 0;
      auVar64._0_8_ = uVar29;
      auVar81._8_8_ = 0;
      auVar81._0_8_ = uVar38;
      auVar97._8_8_ = 0;
      auVar97._0_8_ = dVar30 * dVar39;
      auVar50 = vfmadd213sd_fma(auVar81,auVar64,auVar97);
      auVar65._8_8_ = 0;
      auVar65._0_8_ = uVar31;
      auVar98._8_8_ = 0;
      auVar98._0_8_ = uVar40;
      auVar50 = vfmadd213sd_fma(auVar98,auVar65,auVar50);
      auVar82._8_8_ = 0;
      auVar82._0_8_ = uVar32;
      auVar66._8_8_ = 0;
      auVar66._0_8_ = uVar41;
      auVar50 = vfmadd213sd_fma(auVar66,auVar82,auVar50);
      *(double *)(in_RSI + (long)p23._0_4_ * 8) = (auVar43._0_8_ * auVar47._0_8_) / dVar33;
      *(double *)(in_RSI + (long)(p23._0_4_ + 1) * 8) = (auVar44._0_8_ * auVar48._0_8_) / dVar33;
      *(double *)(in_RSI + (long)(p23._0_4_ + 2) * 8) = (auVar45._0_8_ * auVar49._0_8_) / dVar33;
      *(double *)(in_RSI + (long)(p23._0_4_ + 3) * 8) = (auVar46._0_8_ * auVar50._0_8_) / dVar33;
      p23._0_4_ = p23._0_4_ + 4;
    }
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPU4StateImpl<BEAGLE_CPU_GENERIC>::calcPartialsPartialsFixedScaling(REALTYPE* destP,
                                                                               const REALTYPE* partials1,
                                                                               const REALTYPE* matrices1,
                                                                               const REALTYPE* partials2,
                                                                               const REALTYPE* matrices2,
                                                                               const REALTYPE* scaleFactors,
                                                                               int startPattern,
                                                                               int endPattern) {

#pragma omp parallel for num_threads(kCategoryCount)
    for (int l = 0; l < kCategoryCount; l++) {
        int u = l*4*kPaddedPatternCount;
        if (startPattern != 0) {
          u += 4*startPattern;
        }

        int w = l*4*OFFSET;

        PREFETCH_MATRIX(1,matrices1,w);
        PREFETCH_MATRIX(2,matrices2,w);

        for (int k = startPattern; k < endPattern; k++) {

            // Prefetch scale factor
            const REALTYPE scaleFactor = scaleFactors[k];

            PREFETCH_PARTIALS(1,partials1,u);
            PREFETCH_PARTIALS(2,partials2,u);

            DO_INTEGRATION(1); // defines sum10, sum11, sum12, sum13
            DO_INTEGRATION(2); // defines sum20, sum21, sum22, sum23

            // Final results
            destP[u    ] = sum10 * sum20 / scaleFactor;
            destP[u + 1] = sum11 * sum21 / scaleFactor;
            destP[u + 2] = sum12 * sum22 / scaleFactor;
            destP[u + 3] = sum13 * sum23 / scaleFactor;

            u += 4;
        }
    }
}